

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O2

string * __thiscall
cmFindLibraryCommand::FindFrameworkLibraryNamesPerDir_abi_cxx11_
          (string *__return_storage_ptr__,cmFindLibraryCommand *this)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  pointer pbVar4;
  pointer pbVar5;
  string fwPath;
  string local_d0;
  cmAlphaNum local_b0;
  cmAlphaNum local_80;
  string local_50;
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  pbVar1 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar5 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1) {
    pbVar2 = (this->super_cmFindBase).Names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar4 = (this->super_cmFindBase).Names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar2; pbVar4 = pbVar4 + 1)
    {
      local_b0.View_._M_str = (pbVar5->_M_dataplus)._M_p;
      local_b0.View_._M_len = pbVar5->_M_string_length;
      local_80.View_._M_str = (pbVar4->_M_dataplus)._M_p;
      local_80.View_._M_len = pbVar4->_M_string_length;
      cmStrCat<char[11]>(&local_50,&local_b0,&local_80,(char (*) [11])".framework");
      std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      bVar3 = cmsys::SystemTools::FileIsDirectory(&local_d0);
      if (bVar3) {
        cmsys::SystemTools::CollapseFullPath(__return_storage_ptr__,&local_d0);
        bVar3 = cmFindBase::Validate(&this->super_cmFindBase,__return_storage_ptr__);
        if (bVar3) goto LAB_0028859e;
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_b0);
LAB_0028859e:
  std::__cxx11::string::~string((string *)&local_d0);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindLibraryCommand::FindFrameworkLibraryNamesPerDir()
{
  std::string fwPath;
  // Search for all names in each search path.
  for (std::string const& d : this->SearchPaths) {
    for (std::string const& n : this->Names) {
      fwPath = cmStrCat(d, n, ".framework");
      if (cmSystemTools::FileIsDirectory(fwPath)) {
        auto finalPath = cmSystemTools::CollapseFullPath(fwPath);
        if (this->Validate(finalPath)) {
          return finalPath;
        }
      }
    }
  }

  // No framework found.
  return "";
}